

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::retrieveNode(MemoryLeakDetectorList *this,char *memory)

{
  MemoryLeakDetectorNode *local_28;
  MemoryLeakDetectorNode *cur;
  char *memory_local;
  MemoryLeakDetectorList *this_local;
  
  local_28 = this->head_;
  while( true ) {
    if (local_28 == (MemoryLeakDetectorNode *)0x0) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    if (*(char **)(local_28 + 0x10) == memory) break;
    local_28 = *(MemoryLeakDetectorNode **)(local_28 + 0x38);
  }
  return local_28;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::retrieveNode(char* memory)
{
  MemoryLeakDetectorNode* cur = head_;
  while (cur) {
    if (cur->memory_ == memory)
      return cur;
    cur = cur->next_;
  }
  return NULLPTR;
}